

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shufflechannel.cpp
# Opt level: O2

int __thiscall
ncnn::ShuffleChannel::forward(ShuffleChannel *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _w;
  int _h;
  size_t _elemsize;
  void *__dest;
  int iVar1;
  int iVar2;
  int iVar3;
  int _c;
  int iVar4;
  int _c_00;
  int iVar5;
  int iVar6;
  int iVar7;
  Mat local_c0;
  Mat local_78;
  
  iVar4 = bottom_blob->c;
  iVar1 = this->group;
  iVar2 = -100;
  if (iVar4 % iVar1 == 0) {
    _w = bottom_blob->w;
    _h = bottom_blob->h;
    _elemsize = bottom_blob->elemsize;
    iVar7 = iVar4 / iVar1;
    if (this->reverse == 0) {
      iVar7 = iVar1;
    }
    iVar1 = iVar4 / iVar7;
    Mat::create(top_blob,_w,_h,iVar4,_elemsize,opt->blob_allocator);
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar4 = 0;
      if (0 < iVar1) {
        iVar4 = iVar1;
      }
      iVar2 = 0;
      if (0 < iVar7) {
        iVar2 = iVar7;
      }
      iVar5 = 0;
      for (iVar3 = 0; _c = iVar3, _c_00 = iVar5, iVar6 = iVar4, iVar3 != iVar2; iVar3 = iVar3 + 1) {
        while (iVar6 != 0) {
          Mat::channel(&local_c0,top_blob,_c);
          __dest = local_c0.data;
          Mat::channel(&local_78,bottom_blob,_c_00);
          memcpy(__dest,local_78.data,(long)_h * (long)_w * _elemsize);
          Mat::~Mat(&local_78);
          Mat::~Mat(&local_c0);
          _c = _c + iVar7;
          _c_00 = _c_00 + 1;
          iVar6 = iVar6 + -1;
        }
        iVar5 = iVar5 + iVar1;
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int ShuffleChannel::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    if (channels % group != 0)
    {
        // reject invalid group
        return -100;
    }

    int _group = reverse ? channels / group : group;
    int channels_per_group = channels / _group;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const size_t feature_sz = (size_t)w * h * elemsize;
    for (int i = 0; i < _group; i++)
    {
        for (int j = 0; j < channels_per_group; j++)
        {
            int src_q = channels_per_group * i + j;
            int dst_q = _group * j + i;
            memcpy(top_blob.channel(dst_q), bottom_blob.channel(src_q), feature_sz);
        }
    }

    return 0;
}